

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2wedge_relations.cc
# Opt level: O3

bool S2::WedgeIntersects(S2Point *a0,S2Point *ab1,S2Point *a2,S2Point *b0,S2Point *b2)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = s2pred::OrderedCCW(a0,b2,b0,ab1);
  bVar2 = true;
  if (bVar1) {
    bVar2 = s2pred::OrderedCCW(b0,a2,a0,ab1);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool WedgeIntersects(
    const S2Point& a0, const S2Point& ab1, const S2Point& a2,
    const S2Point& b0, const S2Point& b2) {
  // For A not to intersect B (where each loop interior is defined to be
  // its left side), the CCW edge order around ab1 must be a0 b2 b0 a2.
  // Note that it's important to write these conditions as negatives
  // (!OrderedCCW(a,b,c,o) rather than Ordered(c,b,a,o)) to get correct
  // results when two vertices are the same.
  return !(s2pred::OrderedCCW(a0, b2, b0, ab1) &&
           s2pred::OrderedCCW(b0, a2, a0, ab1));
}